

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::pumpTo(WebSocketPipeImpl *this,WebSocket *other)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  SourceLocation location_00;
  OwnPromiseNode OVar2;
  void *pvVar3;
  long *in_RDX;
  TransformPromiseNodeBase *this_00;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3918:45),_void>
  onAbort;
  OwnPromiseNode intermediate;
  OwnPromiseNode local_88;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_80;
  WebSocket local_78;
  Disposer DStack_70;
  undefined8 local_68;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_60;
  OwnPromiseNode local_58;
  char *local_50;
  char *pcStack_48;
  WebSocket *local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  (**(code **)(*in_RDX + 0x28))(&local_88);
  pPVar1 = ((local_88.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_88.ptr - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_88,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3918:45)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_0066dbf0;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    ((local_88.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&local_88.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_88,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3918:45)>
               ::anon_class_1_0_00000001_for_func::operator());
    local_88.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0066dbf0;
    local_88.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_78._vptr_WebSocket = (_func_int **)&DAT_0042a172;
  DStack_70._vptr_Disposer = (_func_int **)&DAT_0042a1d1;
  local_68._0_4_ = 0x58b;
  local_68._4_4_ = 0x4c;
  location.function = &DAT_0042a1d1;
  location.fileName = &DAT_0042a172;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  local_60.ptr = &this_00->super_PromiseNode;
  kj::_::maybeChain<void>(&local_58,(Promise<void> *)&local_60,location);
  OVar2.ptr = local_58.ptr;
  local_58.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_58);
  local_80.ptr = OVar2.ptr;
  local_38.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_60);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_88);
  pumpToNoAbort((WebSocketPipeImpl *)&local_78,other);
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_48 = "pumpTo";
  local_40 = (WebSocket *)0xc00000f52;
  location_00.function = "pumpTo";
  location_00.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location_00.lineNumber = 0xf52;
  location_00.columnNumber = 0xc;
  Promise<void>::exclusiveJoin((Promise<void> *)this,(Promise<void> *)&local_78,location_00);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_78);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_80);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> pumpTo(WebSocket& other) override {
    auto onAbort = other.whenAborted().then([]() -> kj::Promise<void> {
      return KJ_EXCEPTION(DISCONNECTED, "WebSocket was aborted");
    });

    return pumpToNoAbort(other).exclusiveJoin(kj::mv(onAbort));
  }